

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# SscWriter.cpp
# Opt level: O0

void __thiscall
adios2::core::engine::SscWriter::DoPutDeferred
          (SscWriter *this,Variable<std::complex<float>_> *variable,complex<float> *data)

{
  int iVar1;
  int iVar2;
  undefined8 uVar3;
  element_type *peVar4;
  string *psVar5;
  undefined8 in_RDX;
  long in_RSI;
  long in_RDI;
  ScopedTimer __var2118;
  undefined4 in_stack_fffffffffffffef8;
  undefined4 in_stack_fffffffffffffefc;
  undefined4 in_stack_ffffffffffffff00;
  undefined4 in_stack_ffffffffffffff04;
  int local_e8;
  allocator local_a1;
  string local_a0 [39];
  allocator local_79;
  string local_78 [39];
  allocator local_51;
  string local_50 [56];
  undefined8 local_18;
  long local_10;
  
  local_18 = in_RDX;
  local_10 = in_RSI;
  if (DoPutDeferred(adios2::core::Variable<std::complex<float>>&,std::complex<float>const*)::
      __var118 == '\0') {
    iVar1 = __cxa_guard_acquire(&DoPutDeferred(adios2::core::Variable<std::complex<float>>&,std::complex<float>const*)
                                 ::__var118);
    if (iVar1 != 0) {
      uVar3 = ps_make_timer_name_("/workspace/llm4binary/github/license_c_cmakelists/ornladios[P]ADIOS2/source/adios2/engine/ssc/SscWriter.cpp"
                                  ,
                                  "virtual void adios2::core::engine::SscWriter::DoPutDeferred(Variable<std::complex<float>> &, const std::complex<float> *)"
                                  ,0x76);
      DoPutDeferred::__var118 = (void *)ps_timer_create_(uVar3);
      __cxa_guard_release(&DoPutDeferred(adios2::core::Variable<std::complex<float>>&,std::complex<float>const*)
                           ::__var118);
    }
  }
  external::perfstubs_profiler::ScopedTimer::ScopedTimer
            ((ScopedTimer *)CONCAT44(in_stack_ffffffffffffff04,in_stack_ffffffffffffff00),
             (void *)CONCAT44(in_stack_fffffffffffffefc,in_stack_fffffffffffffef8));
  std::allocator<char>::allocator();
  std::__cxx11::string::string(local_50,"Engine",&local_51);
  std::allocator<char>::allocator();
  std::__cxx11::string::string(local_78,"SscWriter",&local_79);
  std::allocator<char>::allocator();
  std::__cxx11::string::string(local_a0,"DoPutDeferred",&local_a1);
  psVar5 = (string *)(local_10 + 8);
  if (*(int *)(in_RDI + 0xc0) < 10) {
    local_e8 = 0;
  }
  else {
    local_e8 = adios2::helper::Comm::Rank();
  }
  iVar2 = adios2::helper::Comm::Rank();
  iVar1 = *(int *)(in_RDI + 0xc0);
  adios2::helper::Log(local_50,local_78,local_a0,psVar5,local_e8,iVar2,5,iVar1,INFO);
  std::__cxx11::string::~string(local_a0);
  std::allocator<char>::~allocator((allocator<char> *)&local_a1);
  std::__cxx11::string::~string(local_78);
  std::allocator<char>::~allocator((allocator<char> *)&local_79);
  std::__cxx11::string::~string(local_50);
  std::allocator<char>::~allocator((allocator<char> *)&local_51);
  peVar4 = std::
           __shared_ptr_access<adios2::core::engine::ssc::SscWriterBase,_(__gnu_cxx::_Lock_policy)2,_false,_false>
           ::operator->((__shared_ptr_access<adios2::core::engine::ssc::SscWriterBase,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                         *)0x1ce676);
  (*peVar4->_vptr_SscWriterBase[7])(peVar4,local_10,local_18);
  external::perfstubs_profiler::ScopedTimer::~ScopedTimer
            ((ScopedTimer *)CONCAT44(in_stack_ffffffffffffff04,iVar1));
  return;
}

Assistant:

void SscWriter::DoPutStructSync(VariableStruct &variable, const void *data)
{
    PERFSTUBS_SCOPED_TIMER_FUNC();
    helper::Log("Engine", "SscWriter", "DoPutSync", variable.m_Name,
                m_Verbosity >= 10 ? m_Comm.Rank() : 0, m_Comm.Rank(), 5, m_Verbosity,
                helper::LogMode::INFO);
    m_EngineInstance->PutDeferred(variable, data);
    m_EngineInstance->PerformPuts();
}